

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

int __thiscall
glcts::GeometryShaderRenderingPointsCase::verify
          (GeometryShaderRenderingPointsCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  ulong uVar11;
  long lVar12;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  uint local_7a0;
  uint local_79c;
  int local_798;
  int local_794;
  MessageBuilder local_790;
  uint local_60c;
  uint local_608;
  uint local_604;
  uint local_600;
  uint local_5fc;
  int local_5f8;
  int local_5f4;
  MessageBuilder local_5f0;
  uint local_46c;
  int local_468;
  int index_2;
  int t2_center [2];
  int t1_center [2];
  int t2 [6];
  int local_438;
  int local_434;
  int t1 [6];
  byte *pbStack_410;
  uint row_width_1;
  uchar *reference_data_2;
  uchar *rendered_data_2;
  int point_y;
  int point_x;
  uint epsilon;
  int n_point_1;
  uint local_3e8;
  uint local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  MessageBuilder local_3d0;
  uint local_24c;
  byte *pbStack_248;
  int index_1;
  uchar *rendered_data_1;
  uchar *reference_data_1;
  int y_1;
  int x_1;
  int n;
  int sample_region_width_px;
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  int local_208;
  int local_204;
  MessageBuilder local_200;
  int local_7c;
  uint local_78;
  int n_pixel;
  int index;
  int local_64;
  int local_60;
  int y_start;
  int y;
  int x_start;
  int x;
  int dy;
  int dx;
  int n_edge;
  int sample_region_edge_px;
  int row_width;
  uchar *rendered_data;
  uchar *reference_data;
  int local_28;
  uint n_point;
  uint rt_width;
  uint rt_height;
  uchar *data_local;
  uint instance_id_local;
  _draw_call_type drawcall_type_local;
  GeometryShaderRenderingPointsCase *this_local;
  
  data_local._4_4_ = (int)ctx;
  data_local._0_4_ = (int)sig;
  n_point = 0;
  local_28 = 0;
  _rt_width = siglen;
  _instance_id_local = this;
  if ((data_local._4_4_ == 1) || (data_local._4_4_ == 3)) {
    uVar1 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode[5])();
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])(this,(ulong)uVar1,&local_28,&n_point);
  }
  else {
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])(this,1,&local_28,&n_point);
  }
  iVar2 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar2 == 0) {
    x_1 = 5;
    for (y_1 = 0; y_1 < 8; y_1 = y_1 + 1) {
      if (((data_local._4_4_ == 2) || (data_local._4_4_ == 3)) || (data_local._4_4_ == 4)) {
        local_24c = (uint)this->m_unordered_elements_data[y_1];
        reference_data_1._4_4_ = local_24c * 5 + 1;
        reference_data_1._0_4_ = (int)data_local * 5 + 1;
        iVar2 = (7 - local_24c) * 4;
        iVar3 = (int)reference_data_1 * local_28 + reference_data_1._4_4_;
      }
      else {
        reference_data_1._4_4_ = y_1 * 5 + 1;
        reference_data_1._0_4_ = (int)data_local * 5 + 1;
        iVar2 = y_1 << 2;
        iVar3 = (int)reference_data_1 * local_28 + reference_data_1._4_4_;
      }
      rendered_data_1 = verify::ref_data + iVar2;
      pbStack_248 = (byte *)(_rt_width + (uint)(iVar3 * 4));
      if (*(int *)pbStack_248 != *(int *)rendered_data_1) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3d0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [18])"Reference data: [");
        local_3d4 = (uint)*rendered_data_1;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3d4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_3d8 = (uint)rendered_data_1[1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3d8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_3dc = (uint)rendered_data_1[2];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3dc);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_3e0 = (uint)rendered_data_1[3];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3e0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"] for pixel at (");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)((long)&reference_data_1 + 4));
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&reference_data_1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])") does not match  [");
        local_3e4 = (uint)*pbStack_248;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3e4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_3e8 = (uint)pbStack_248[1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_3e8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        n_point_1 = (int)pbStack_248[2];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&n_point_1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        epsilon = (uint)pbStack_248[3];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&epsilon);
        tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2c23dab);
        tcu::MessageBuilder::~MessageBuilder(&local_3d0);
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x748);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  else if (iVar2 == 1) {
    for (reference_data._4_4_ = 0; y_1 = reference_data._4_4_, reference_data._4_4_ < 8;
        reference_data._4_4_ = reference_data._4_4_ + 1) {
      rendered_data = (uchar *)0x0;
      _sample_region_edge_px = (byte *)0x0;
      n_edge = local_28 * 4;
      dx = 5;
      for (dy = 0; dy < 4; dy = dy + 1) {
        x = 0;
        x_start = 0;
        y = 0;
        y_start = 0;
        local_60 = 0;
        local_64 = 0;
        switch(dy) {
        case 0:
          x = 1;
          x_start = 0;
          y_start = 1;
          local_64 = 1;
          break;
        case 1:
          x = 0;
          x_start = 1;
          y_start = 5;
          local_64 = 1;
          break;
        case 2:
          x = -1;
          x_start = 0;
          y_start = 5;
          local_64 = 5;
          break;
        case 3:
          x = 0;
          x_start = -1;
          y_start = 1;
          local_64 = 5;
          break;
        default:
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,"Invalid edge index",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x6e6);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        if ((data_local._4_4_ == 0) || (data_local._4_4_ == 1)) {
          uVar11 = (ulong)(reference_data._4_4_ << 2);
          uVar1 = reference_data._4_4_;
        }
        else {
          local_78 = (uint)this->m_unordered_elements_data[reference_data._4_4_];
          uVar11 = (ulong)(int)((7 - local_78) * 4);
          uVar1 = local_78;
        }
        rendered_data = verify::ref_data + uVar11;
        y = y_start + uVar1 * 7;
        local_60 = local_64 + (int)data_local * 7;
        for (local_7c = 0; local_7c < 5; local_7c = local_7c + 1) {
          _sample_region_edge_px = (byte *)(_rt_width + (long)(local_60 * n_edge) + (long)(y << 2));
          if (*(int *)_sample_region_edge_px != *(int *)rendered_data) {
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                                super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_200,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [16])"At            (");
            local_204 = y;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_204);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            local_208 = local_60;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_208);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [19])"), rendered data (");
            local_20c = (uint)*_sample_region_edge_px;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_20c);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            local_210 = (uint)_sample_region_edge_px[1];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_210);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            local_214 = (uint)_sample_region_edge_px[2];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_214);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            local_218 = (uint)_sample_region_edge_px[3];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_218);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(char (*) [37])") is different from reference data (");
            local_21c = (uint)*rendered_data;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_21c);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            local_220 = (uint)rendered_data[1];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_220);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            sample_region_width_px = (int)rendered_data[2];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&sample_region_width_px);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
            n = (int)rendered_data[3];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&n);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a94734);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_200);
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,"Data comparison failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0x70d);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          y = x + y;
          local_60 = x_start + local_60;
        }
      }
    }
  }
  else {
    if (iVar2 != 2) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Unsupported output layout qualifier requested.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x7b5);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (point_x = 0; iVar2 = (int)data_local, y_1 = point_x, point_x < 8; point_x = point_x + 1) {
      iVar3 = (int)data_local * 6;
      iVar4 = local_28 * 4;
      memset(&local_438,0,0x18);
      memset(t1_center,0,0x18);
      memset(t2_center,0,8);
      memset(&local_468,0,8);
      if (((data_local._4_4_ == 2) || (data_local._4_4_ == 3)) || (data_local._4_4_ == 4)) {
        local_46c = (uint)this->m_unordered_elements_data[point_x];
        iVar5 = (7 - local_46c) * 4;
        uVar1 = local_46c;
      }
      else {
        iVar5 = point_x << 2;
        uVar1 = point_x;
      }
      lVar12 = (long)iVar5;
      rendered_data_2._4_4_ = uVar1 * 6;
      pbStack_410 = verify::ref_data_triangle_strip + lVar12;
      local_438 = rendered_data_2._4_4_;
      local_434 = iVar3 + 6;
      t1[0] = rendered_data_2._4_4_;
      t1[2] = rendered_data_2._4_4_ + 6;
      t1[3] = iVar3 + 6;
      t1_center[0] = rendered_data_2._4_4_ + 6;
      t1_center[1] = iVar3 + 6;
      iVar5 = (int)(uVar1 * 0xc + t1[2]) / 3;
      local_468 = (int)(t1_center[0] + uVar1 * 0xc + 6) / 3;
      iVar6 = (local_434 + iVar3 + t1[3]) / 3;
      index_2 = (t1_center[1] + iVar2 * 0xc) / 3;
      pbVar7 = (byte *)(_rt_width + (uint)(iVar6 * iVar4) + (long)(iVar5 << 2));
      t2_center[0] = iVar5;
      t2_center[1] = iVar6;
      t1[1] = iVar3;
      uVar1 = de::abs<int>((uint)*pbVar7 - (uint)*pbStack_410);
      iVar3 = index_2;
      iVar2 = local_468;
      if ((((1 < uVar1) || (pbVar7[1] != 0)) || (pbVar7[2] != 0)) || (pbVar7[3] != 0)) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5f0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_5f0,(char (*) [5])"At (");
        local_5f4 = iVar5;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_5f4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_5f8 = iVar6;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_5f8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b56371);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"rendered pixel (");
        local_5fc = (uint)*pbVar7;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_5fc);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_600 = (uint)pbVar7[1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_600);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_604 = (uint)pbVar7[2];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_604);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_608 = (uint)pbVar7[3];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_608);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b56371);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"is different than (");
        local_60c = (uint)*pbStack_410;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_60c);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [12])", 0, 0, 0).");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x79a);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pbVar7 = (byte *)(_rt_width + (uint)(index_2 * iVar4) + (long)(local_468 << 2));
      if (((*pbVar7 != 0) ||
          (uVar1 = de::abs<int>((uint)pbVar7[1] - (uint)verify::ref_data_triangle_strip[lVar12 + 1])
          , 1 < uVar1)) || ((pbVar7[2] != 0 || (pbVar7[3] != 0)))) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_790,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_790,(char (*) [5])"At (");
        local_794 = iVar2;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_794);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_798 = iVar3;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_798);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b56371);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"rendered pixel (");
        local_79c = (uint)*pbVar7;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_79c);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_7a0 = (uint)pbVar7[1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_7a0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_7a4 = (uint)pbVar7[2];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_7a4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        local_7a8 = (uint)pbVar7[3];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_7a8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b56371);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [23])"is different than (0, ");
        local_7ac = (uint)verify::ref_data_triangle_strip[lVar12 + 1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_7ac);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])0x2b0b3e5);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_790);
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x7ac);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  return y_1;
}

Assistant:

void GeometryShaderRenderingPointsCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											   const unsigned char* data)
{
	/* The array is directly related to vertex shader contents for "points" and "line_strip"
	 * outputs */
	static const unsigned char ref_data[] = { 255, 0, 0, 0,   0,   255, 0,   0, 0,   0,   255, 0,
											  0,   0, 0, 255, 255, 255, 0,   0, 255, 0,   255, 0,
											  255, 0, 0, 255, 255, 255, 255, 0, 255, 255, 0,   255 };
	/* The array refers to colors as defined in vertex shader used for "triangle_strip"
	 * output.
	 */
	static const unsigned char ref_data_triangle_strip[] = {
		(unsigned char)(0.1f * 255), (unsigned char)(0.8f * 255), 0,   0,
		(unsigned char)(0.2f * 255), (unsigned char)(0.7f * 255), 0,   0,
		(unsigned char)(0.3f * 255), (unsigned char)(0.6f * 255), 255, 0,
		(unsigned char)(0.4f * 255), (unsigned char)(0.5f * 255), 0,   255,
		(unsigned char)(0.5f * 255), (unsigned char)(0.4f * 255), 0,   0,
		(unsigned char)(0.6f * 255), (unsigned char)(0.3f * 255), 255, 0,
		(unsigned char)(0.7f * 255), (unsigned char)(0.2f * 255), 0,   255,
		(unsigned char)(0.8f * 255), (unsigned char)(0.1f * 255), 255, 0
	};
	unsigned int rt_height = 0;
	unsigned int rt_width  = 0;

	/* Retrieve render-target size */
	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			/* Each point takes a 7x7 block. The test should verify that the second "nested" block
			 * is of the valid color. Blocks can be built on top of each other if instanced draw
			 * calls are used. */
			const unsigned char* reference_data		   = NULL;
			const unsigned char* rendered_data		   = NULL;
			const int			 row_width			   = rt_width * 4 /* components */;
			const int			 sample_region_edge_px = 5 /* pixels */;

			for (int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
			{
				/* Edge 1: TL->TR
				 * Edge 2: TR->BR
				 * Edge 3: BR->BL
				 * Edge 4: BL->TL
				 */
				int dx		= 0;
				int dy		= 0;
				int x		= 0;
				int x_start = 0;
				int y		= 0;
				int y_start = 0;

				switch (n_edge)
				{
				/* NOTE: The numbers here are as per test spec */
				case 0:
					dx		= 1 /* px */;
					dy		= 0 /* px */;
					x_start = 1 /* px */;
					y_start = 1 /* px */;
					break;
				case 1:
					dx		= 0 /* px */;
					dy		= 1 /* px */;
					x_start = 5 /* px */;
					y_start = 1 /* px */;
					break;
				case 2:
					dx		= -1 /* px */;
					dy		= 0 /* px */;
					x_start = 5 /* px */;
					y_start = 5 /* px */;
					break;
				case 3:
					dx		= 0 /* px */;
					dy		= -1 /* px */;
					x_start = 1 /* px */;
					y_start = 5 /* px */;
					break;

				default:
				{
					TCU_FAIL("Invalid edge index");
				}
				} /* switch (n_edge) */

				/* What color should the pixels have? */
				if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS ||
					drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED)
				{
					reference_data = ref_data + n_point * 4 /* components */;
					x			   = x_start + n_point * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}
				else
				{
					int index = m_unordered_elements_data[n_point];

					reference_data = ref_data + (8 - 1 - index) * 4 /* components */;
					x			   = x_start + index * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}

				/* Verify edge pixels */
				for (int n_pixel = 0; n_pixel < sample_region_edge_px; ++n_pixel)
				{
					rendered_data = data + y * row_width + x * 4 /* components */;

					if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "At            (" << (int)x << ", " << (int)y
										   << "), "
											  "rendered data ("
										   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
										   << (int)rendered_data[2] << ", " << (int)rendered_data[3]
										   << ") "
											  "is different from reference data ("
										   << (int)reference_data[0] << ", " << (int)reference_data[1] << ", "
										   << (int)reference_data[2] << ", " << (int)reference_data[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Data comparison failed");
					} /* if (data comparison failed) */

					/* Move to next pixel */
					x += dx;
					y += dy;
				} /* for (all pixels) */
			}	 /* for (all edges) */
		}		  /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* For each 3px high row, we want to sample the second row. Area of a single "pixel" (incl. delta)
		 * can take no more than 5px, with the actual sampled area located in the second pixel.
		 */
		const int sample_region_width_px = 5; /* pixels */

		for (int n = 0; n < 8 /* points */; ++n)
		{
			int					 x				= 0;
			int					 y				= 0;
			const unsigned char* reference_data = NULL;
			const unsigned char* rendered_data  = NULL;

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				/* For indexed calls, vertex data is laid out in a reversed ordered */
				int index = m_unordered_elements_data[n];

				x			   = index * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + ((8 - 1 - index) * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			} /* if (draw call is indiced) */
			else
			{
				x			   = n * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + (n * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			}

			if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Reference data: [" << (int)reference_data[0] << ", "
								   << (int)reference_data[1] << ", " << (int)reference_data[2] << ", "
								   << (int)reference_data[3] << "] "
																"for pixel at ("
								   << x << ", " << y << ") "
														"does not match  ["
								   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
								   << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ").";

				TCU_FAIL("Data comparison failed.");
			} /* if (memcmp(rendered_data, reference_data, 4) != 0) */
		}	 /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* A pair of adjacent triangles is contained within a 6x6 bounding box.
		 * The box is defined by top-left corner which is located at input point's
		 * location.
		 * The left triangle should only use red channel, the one on the right
		 * should only use green channel.
		 * We find centroid for each triangle, sample its color and make sure
		 * it's valid.
		 */
		for (int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			const unsigned int   epsilon					   = 1;
			int					 point_x					   = 0;
			int					 point_y					   = 6 * instance_id;
			const unsigned char* rendered_data				   = NULL;
			const unsigned char* reference_data				   = 0;
			const unsigned int   row_width					   = rt_width * 4 /* components */;
			int					 t1[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t2[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t1_center[2 /*     {x, y} */] = { 0 };
			int					 t2_center[2 /*     {x, y} */] = { 0 };

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				int index = m_unordered_elements_data[n_point];

				point_x		   = 6 * index;
				reference_data = ref_data_triangle_strip + (8 - 1 - index) * 4 /* components */;
			}
			else
			{
				point_x		   = 6 * n_point;
				reference_data = ref_data_triangle_strip + n_point * 4 /* components */;
			}

			/* Calculate triangle vertex locations (corresponds to geometry shader logic) */
			t1[0] = point_x;
			t1[1] = point_y + 6;
			t1[2] = point_x;
			t1[3] = point_y;
			t1[4] = point_x + 6;
			t1[5] = point_y + 6;

			t2[0] = point_x + 6;
			t2[1] = point_y + 6;
			t2[2] = point_x;
			t2[3] = point_y;
			t2[4] = point_x + 6;
			t2[5] = point_y;

			/* Calculate centroid locations */
			t1_center[0] = (t1[0] + t1[2] + t1[4]) / 3;
			t2_center[0] = (t2[0] + t2[2] + t2[4]) / 3;
			t1_center[1] = (t1[1] + t1[3] + t1[5]) / 3;
			t2_center[1] = (t2[1] + t2[3] + t2[5]) / 3;

			/* Check the first triangle */
			point_x = t1_center[0];
			point_y = t1_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if ((unsigned int)de::abs((int)rendered_data[0] - reference_data[0]) > epsilon || rendered_data[1] != 0 ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (" << (int)reference_data[0] << ", 0, 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}

			/* Check the other triangle */
			point_x = t2_center[0];
			point_y = t2_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if (rendered_data[0] != 0 || (unsigned int)de::abs((int)rendered_data[1] - reference_data[1]) > epsilon ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (0, " << (int)reference_data[1] << ", 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}
		} /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:*/

	default:
	{
		TCU_FAIL("Unsupported output layout qualifier requested.");

		break;
	}
	} /* switch(m_output_type) */
}